

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall gl4cts::DirectStateAccess::Textures::CopyErrorsTest::Test2D(CopyErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  deUint32 dVar12;
  undefined4 extraout_var;
  ErrorsUtilities *pEVar14;
  long lVar13;
  
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar11);
  (**(code **)(lVar13 + 0x78))(0x8d40,this->m_fbo_incomplete);
  dVar12 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar12,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2ae9);
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D_dst;
  (**(code **)(lVar13 + 0x398))(pEVar14,0,0,0,0,0,4,4);
  bVar1 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x506,"glCopyTextureSubImage2D",
                     "the object bound to READ_FRAMEBUFFER_BINDING is not framebuffer complete.");
  (**(code **)(lVar13 + 0x78))(0x8d40,this->m_fbo);
  dVar12 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar12,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2af6);
  (**(code **)(lVar13 + 0x1218))(0x8ce0);
  dVar12 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar12,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2af9);
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_invalid;
  (**(code **)(lVar13 + 0x398))(pEVar14,0,0,0,0,0,4,4);
  bVar2 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x502,"glCopyTextureSubImage2D",
                     "texture is not the name of an existing texture object.");
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_1D_dst;
  (**(code **)(lVar13 + 0x398))(pEVar14,0,0,0,0,0,4,4);
  bVar3 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x502,"glCopyTextureSubImage2D",
                     "the effective target of does not correspond to one of the texture targets supported by the function.."
                    );
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D_dst;
  (**(code **)(lVar13 + 0x398))(pEVar14,0xffffffffffffffff,0,0,0,0,4,4);
  bVar4 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x501,"glCopyTextureSubImage2D",
                     "level is less than 0.");
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D_dst;
  (**(code **)(lVar13 + 0x398))(pEVar14,0,0xffffffffffffffff,0,0,0,4,4);
  bVar5 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x501,"glCopyTextureSubImage2D",
                     "xoffset<0.");
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D_dst;
  (**(code **)(lVar13 + 0x398))(pEVar14,0,1,0,0,0,4,4);
  bVar6 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x501,"glCopyTextureSubImage2D",
                     "(xoffset+width)>w, where w is the TEXTURE_WIDTH of the texture image being modified."
                    );
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D_dst;
  (**(code **)(lVar13 + 0x398))(pEVar14,0,0,0xffffffffffffffff,0,0,4,4);
  bVar7 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x501,"glCopyTextureSubImage2D",
                     "yoffset<0.");
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D_dst;
  (**(code **)(lVar13 + 0x398))(pEVar14,0,0,1,0,0,4,4);
  bVar8 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x501,"glCopyTextureSubImage2D",
                     "(yoffset+height)>h, where h is the TEXTURE_HEIGHT of the texture image being modified."
                    );
  (**(code **)(lVar13 + 0x1218))(0);
  dVar12 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar12,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2b28);
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D_dst;
  (**(code **)(lVar13 + 0x398))(pEVar14,0,0,0,0,0,4,4);
  bVar9 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x502,"glCopyTextureSubImage2D",
                     "the read buffer is NONE.");
  (**(code **)(lVar13 + 0x78))(0x8d40,this->m_fbo_ms);
  dVar12 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar12,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2b32);
  (**(code **)(lVar13 + 0x1218))(0x8ce0);
  dVar12 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar12,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2b35);
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D_dst;
  (**(code **)(lVar13 + 0x398))(pEVar14,0,0,0,0,0,4,4);
  bVar10 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar14,(this->super_TestCase).m_context,0x502,"glCopyTextureSubImage2D",
                      "the effective value of SAMPLE_BUFFERS for the read framebuffer is one.");
  return (bVar10 && (bVar9 && bVar8)) &&
         ((bVar7 && (bVar6 && bVar5)) && ((bVar4 && bVar3) && (bVar2 && bVar1)));
}

Assistant:

bool CopyErrorsTest::Test2D()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	/* Bind framebuffer. */
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_incomplete);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	/* Check that INVALID_FRAMEBUFFER_OPERATION is generated by
	 CopyTextureSubImage2D if the object bound to READ_FRAMEBUFFER_BINDING is
	 not framebuffer complete. */
	{
		gl.copyTextureSubImage2D(m_to_2D_dst, 0, 0, 0, 0, 0, s_width, s_height);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_FRAMEBUFFER_OPERATION, "glCopyTextureSubImage2D",
								  "the object bound to READ_FRAMEBUFFER_BINDING is not framebuffer complete.");
	}

	/* Bind framebuffer. */
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	gl.readBuffer(GL_COLOR_ATTACHMENT0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	/* Check that INVALID_OPERATION is generated by CopyTextureSubImage2D if
	 texture is not the name of an existing texture object, or if the
	 effective target of texture is not TEXTURE_2D. */
	{
		gl.copyTextureSubImage2D(m_to_invalid, 0, 0, 0, 0, 0, s_width, s_height);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCopyTextureSubImage2D",
								  "texture is not the name of an existing texture object.");

		gl.copyTextureSubImage2D(m_to_1D_dst, 0, 0, 0, 0, 0, s_width, s_height);
		is_ok &= CheckErrorAndLog(
			m_context, GL_INVALID_OPERATION, "glCopyTextureSubImage2D",
			"the effective target of does not correspond to one of the texture targets supported by the function..");
	}

	/* Check that INVALID_VALUE is generated by CopyTextureSubImage2D if level is less than 0. */
	{
		gl.copyTextureSubImage2D(m_to_2D_dst, -1, 0, 0, 0, 0, s_width, s_height);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCopyTextureSubImage2D", "level is less than 0.");
	}

	/* Check that INVALID_VALUE is generated by CopyTextureSubImage2D if
	 xoffset<0, (xoffset+width)>w, yoffset<0, or (yoffset+height)>0, where w
	 is the TEXTURE_WIDTH, h is the TEXTURE_HEIGHT and of the texture image
	 being modified. */
	{
		gl.copyTextureSubImage2D(m_to_2D_dst, 0, -1, 0, 0, 0, s_width, s_height);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCopyTextureSubImage2D", "xoffset<0.");

		gl.copyTextureSubImage2D(m_to_2D_dst, 0, 1, 0, 0, 0, s_width, s_height);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCopyTextureSubImage2D",
							 "(xoffset+width)>w, where w is the TEXTURE_WIDTH of the texture image being modified.");

		gl.copyTextureSubImage2D(m_to_2D_dst, 0, 0, -1, 0, 0, s_width, s_height);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCopyTextureSubImage2D", "yoffset<0.");

		gl.copyTextureSubImage2D(m_to_2D_dst, 0, 0, 1, 0, 0, s_width, s_height);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCopyTextureSubImage2D",
							 "(yoffset+height)>h, where h is the TEXTURE_HEIGHT of the texture image being modified.");
	}

	/* Check that INVALID_OPERATION is generated by CopyTextureSubImage2D if
	 the read buffer is NONE. */
	gl.readBuffer(GL_NONE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	{
		gl.copyTextureSubImage2D(m_to_2D_dst, 0, 0, 0, 0, 0, s_width, s_height);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCopyTextureSubImage2D", "the read buffer is NONE.");
	}

	/* Bind multisample framebuffer. */
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_ms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	gl.readBuffer(GL_COLOR_ATTACHMENT0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	/* Check that INVALID_OPERATION is generated by CopyTextureSubImage2D if
	 the effective value of SAMPLE_BUFFERS for the read
	 framebuffer is one. */
	{
		gl.copyTextureSubImage2D(m_to_2D_dst, 0, 0, 0, 0, 0, s_width, s_height);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCopyTextureSubImage2D",
								  "the effective value of SAMPLE_BUFFERS for the read framebuffer is one.");
	}

	return is_ok;
}